

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-util.c
# Opt level: O1

object_kind * lookup_kind(wchar_t tval,wchar_t sval)

{
  bool bVar1;
  ulong uVar2;
  char *pcVar3;
  object_kind *kind;
  object_kind *poVar4;
  object_kind *unaff_R14;
  
  uVar2 = (ulong)z_info->k_max;
  poVar4 = k_info;
  while( true ) {
    if (uVar2 == 0) {
      pcVar3 = tval_find_name(tval);
      msg("No object: %d:%d (%s)",tval,sval,pcVar3);
      return (object_kind *)0x0;
    }
    if ((poVar4->tval == tval) && (poVar4->sval == sval)) {
      bVar1 = false;
      unaff_R14 = poVar4;
    }
    else {
      bVar1 = true;
    }
    if (!bVar1) break;
    poVar4 = poVar4 + 1;
    uVar2 = uVar2 - 1;
  }
  return unaff_R14;
}

Assistant:

struct object_kind *lookup_kind(int tval, int sval)
{
	int k;

	/* Look for it */
	for (k = 0; k < z_info->k_max; k++) {
		struct object_kind *kind = &k_info[k];
		if (kind->tval == tval && kind->sval == sval)
			return kind;
	}

	/* Failure */
	msg("No object: %d:%d (%s)", tval, sval, tval_find_name(tval));
	return NULL;
}